

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptsig_p2pkh_from_sig
              (uchar *pub_key,size_t pub_key_len,uchar *sig,size_t sig_len,uint32_t sighash,
              uchar *bytes_out,size_t len,size_t *written)

{
  size_t sig_len_00;
  int iVar1;
  size_t der_len;
  uchar buff [73];
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (sighash < 0x100) {
    iVar1 = wally_ec_sig_to_der(sig,sig_len,buff,0x49,&der_len);
    if (iVar1 == 0) {
      sig_len_00 = der_len + 1;
      buff[der_len] = (uchar)sighash;
      der_len = sig_len_00;
      iVar1 = wally_scriptsig_p2pkh_from_der
                        (pub_key,pub_key_len,buff,sig_len_00,bytes_out,len,written);
      wally_clear(buff,der_len);
    }
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int wally_scriptsig_p2pkh_from_sig(const unsigned char *pub_key, size_t pub_key_len,
                                   const unsigned char *sig, size_t sig_len,
                                   uint32_t sighash,
                                   unsigned char *bytes_out, size_t len, size_t *written)
{
    unsigned char buff[EC_SIGNATURE_DER_MAX_LEN + 1];
    size_t der_len;
    int ret;

    if (written)
        *written = 0;
    if (sighash & 0xffffff00)
        return WALLY_EINVAL;

    ret = wally_ec_sig_to_der(sig, sig_len, buff, sizeof(buff), &der_len);
    if (ret == WALLY_OK) {
        buff[der_len++] = sighash & 0xff;
        ret = wally_scriptsig_p2pkh_from_der(pub_key, pub_key_len,
                                             buff, der_len,
                                             bytes_out, len, written);
        wally_clear(buff, der_len);
    }
    return ret;
}